

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O0

void Create_Bouncing_Button(void)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  undefined8 uVar6;
  Am_Value_List *pAVar7;
  Am_Method_Wrapper *pAVar8;
  Am_Slot_Flags flags;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Value local_b0;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Value_List local_88 [16];
  Am_Object local_78;
  Am_Object local_70;
  Am_Time local_68 [8];
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value_List local_40 [16];
  Am_Object local_30;
  Am_Object local_28 [3];
  Am_Object local_10;
  
  uVar3 = Am_Object::Valid();
  if ((uVar3 & 1) == 0) {
    Am_Object::Create((char *)local_28);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Gray);
    uVar1 = Am_Object::Set((ushort)local_28,(Am_Wrapper *)0x6a,(ulong)pAVar4);
    uVar1 = Am_Object::Set(uVar1,100,500);
    uVar1 = Am_Object::Set(uVar1,0x65,0x14);
    uVar1 = Am_Object::Set(uVar1,0x66,300);
    pAVar5 = (Am_Object *)Am_Object::Set(uVar1,0x67,300);
    Am_Object::operator=(&win2,pAVar5);
    Am_Object::~Am_Object(local_28);
    Am_Object::Am_Object(&local_30,&win2);
    Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_30,0),1);
    Am_Object::~Am_Object(&local_30);
    Am_Value_List::Am_Value_List(local_40);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Gray);
    uVar6 = Am_Value_List::Add(local_40,pAVar4,1);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Yellow);
    uVar6 = Am_Value_List::Add(uVar6,pAVar4,1);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Blue);
    uVar6 = Am_Value_List::Add(uVar6,pAVar4,1);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Orange);
    uVar6 = Am_Value_List::Add(uVar6,pAVar4,1);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Green);
    pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar6,pAVar4,1);
    Am_Value_List::operator=((Am_Value_List *)color_list,pAVar7);
    Am_Value_List::~Am_Value_List(local_40);
    Am_Value_List::Start();
    Am_Object::Create((char *)&local_48);
    uVar1 = Am_Object::Set((ushort)&local_48,100,0x14);
    uVar1 = Am_Object::Set(uVar1,0x65,0x14);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Gray);
    uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar4);
    Am_Object::Create((char *)&local_60);
    Am_Time::Am_Time(local_68,2000);
    pAVar4 = Am_Time::operator_cast_to_Am_Wrapper_(local_68);
    uVar3 = Am_Object::Set((ushort)&local_60,(Am_Wrapper *)0xfd,(ulong)pAVar4);
    Am_Object::Get_Object((ushort)&local_58,uVar3);
    pAVar8 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&next_button_color);
    flags = Am_Object::Set((ushort)&local_58,(Am_Method_Wrapper *)0xca,(ulong)pAVar8);
    Am_Object::Get_Owner(&local_50,flags);
    pAVar5 = (Am_Object *)Am_Object::operator=(&animated_button_color,&local_50);
    uVar3 = Am_Animate_With(pAVar5);
    uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x6a,uVar3);
    Am_Object::Create((char *)&local_78);
    pAVar8 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&start_button_anims);
    uVar2 = Am_Object::Set((ushort)&local_78,(Am_Method_Wrapper *)0xca,(ulong)pAVar8);
    Am_Value_List::Am_Value_List(local_88);
    uVar6 = Am_Value_List::Add(local_88,"Animate My Color   ",1);
    uVar6 = Am_Value_List::Add(uVar6,"Animate My Position",1);
    pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar6,"Stop               ",1);
    pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
    pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x1aa,(ulong)pAVar4);
    Am_Object::Am_Object(&local_70,pAVar5);
    pAVar5 = (Am_Object *)Am_Object::Set_Part(uVar1,(Am_Object)0xc5,(ulong)&local_70);
    Am_Object::operator=(&animated_button,pAVar5);
    Am_Object::~Am_Object(&local_70);
    Am_Value_List::~Am_Value_List(local_88);
    Am_Object::~Am_Object(&local_78);
    Am_Object::~Am_Object(&local_50);
    Am_Object::~Am_Object(&local_58);
    Am_Time::~Am_Time(local_68);
    Am_Object::~Am_Object(&local_60);
    Am_Object::~Am_Object(&local_48);
    Am_Object::Create((char *)&local_90);
    uVar1 = Am_Object::Set((ushort)&local_90,true,1);
    uVar1 = Am_Object::Set(uVar1,true,0);
    uVar1 = Am_Object::Set(uVar1,0xcd,0xffffff9b);
    Am_Object::Create((char *)&local_a0);
    uVar2 = Am_Object::Set((ushort)&local_a0,0x11d,3);
    uVar2 = Am_Object::Set(uVar2,0x11e,3);
    Am_Animation_End_Action::operator_cast_to_Am_Value((Am_Animation_End_Action *)&local_b0);
    pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Value *)0xf0,(ulong)&local_b0);
    Am_Object::Am_Object(&local_98,pAVar5);
    pAVar5 = (Am_Object *)Am_Object::Set_Part(uVar1,(Am_Object)0xc5,(ulong)&local_98);
    Am_Object::operator=(&animated_button_bounce,pAVar5);
    Am_Object::~Am_Object(&local_98);
    Am_Value::~Am_Value(&local_b0);
    Am_Object::~Am_Object(&local_a0);
    Am_Object::~Am_Object(&local_90);
    Am_Object::Am_Object(&local_b8,&animated_button_bounce);
    Am_Object::Add_Part((Am_Object)0x112510,SUB81(&local_b8,0),1);
    Am_Object::~Am_Object(&local_b8);
    Am_Object::Am_Object(&local_c0,&animated_button);
    Am_Object::Add_Part((Am_Object)0x112508,SUB81(&local_c0,0),1);
    Am_Object::~Am_Object(&local_c0);
  }
  else {
    Am_Object::Am_Object(&local_10,&win2);
    Am_To_Top((Am_Object_Data *)&local_10);
    Am_Object::~Am_Object(&local_10);
  }
  return;
}

Assistant:

void
Create_Bouncing_Button()
{
  if (win2.Valid())
    Am_To_Top(win2);
  else {
    win2 = Am_Window.Create("Bouncing Button")
               .Set(Am_FILL_STYLE, Am_Motif_Light_Gray)
               .Set(Am_LEFT, 500)
               .Set(Am_TOP, 20)
               .Set(Am_WIDTH, 300)
               .Set(Am_HEIGHT, 300);
    Am_Screen.Add_Part(win2);
    color_list = Am_Value_List()
                     .Add(Am_Motif_Light_Gray)
                     .Add(Am_Yellow)
                     .Add(Am_Motif_Blue)
                     .Add(Am_Motif_Orange)
                     .Add(Am_Motif_Green);
    color_list.Start();
    animated_button =
        Am_Button.Create("animated_button")
            .Set(Am_LEFT, 20)
            .Set(Am_TOP, 20)
            .Set(Am_FILL_STYLE, Am_Motif_Light_Gray)
            .Set(Am_FILL_STYLE,
                 Am_Animate_With(animated_button_color =
                                     Am_Style_Animator.Create("anim_but_color")
                                         .Set(Am_DURATION, Am_Time(2000))
                                         .Get_Object(Am_COMMAND)
                                         .Set(Am_DO_METHOD, next_button_color)
                                         .Get_Owner()))
            .Set_Part(Am_COMMAND,
                      Am_Cycle_Value_Command.Create("cycle_value")
                          .Set(Am_DO_METHOD, start_button_anims)
                          .Set(Am_LABEL_LIST, Am_Value_List()
                                                  .Add("Animate My Color   ")
                                                  .Add("Animate My Position")
                                                  .Add("Stop               ")));
    animated_button_bounce =
        Am_Animation_Interactor.Create("bounce_button")
            .Set(Am_START_WHEN, true)
            .Set(Am_ACTIVE, false)
            .Set(Am_PRIORITY, -101)
            .Set_Part(Am_COMMAND,
                      Am_Animation_Object_In_Owner_Command.Create()
                          .Set(Am_X_OFFSET, 3)
                          .Set(Am_Y_OFFSET, 3)
                          .Set(Am_ANIMATE_END_ACTION, Am_ANIMATION_BOUNCE));
    animated_button.Add_Part(animated_button_bounce);
    win2.Add_Part(animated_button);
  }
}